

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandQueueExecuteCommandLists
          (ze_command_queue_handle_t hCommandQueue,uint32_t numCommandLists,
          ze_command_list_handle_t *phCommandLists,ze_fence_handle_t hFence)

{
  code *pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  void *pvVar4;
  undefined8 local_68;
  ulong local_58;
  size_t i;
  ze_command_list_handle_t *phCommandListsLocal;
  ze_pfnCommandQueueExecuteCommandLists_t pfnExecuteCommandLists;
  dditable_t *dditable;
  ze_result_t result;
  ze_fence_handle_t hFence_local;
  ze_command_list_handle_t *phCommandLists_local;
  uint32_t numCommandLists_local;
  ze_command_queue_handle_t hCommandQueue_local;
  
  pcVar1 = *(code **)(*(long *)(hCommandQueue + 8) + 0x1f0);
  if (pcVar1 == (code *)0x0) {
    hCommandQueue_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = *(undefined8 *)hCommandQueue;
    uVar3 = SUB168(ZEXT416(numCommandLists) * ZEXT816(8),0);
    if (SUB168(ZEXT416(numCommandLists) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    for (local_58 = 0;
        phCommandLists != (ze_command_list_handle_t *)0x0 && local_58 < numCommandLists;
        local_58 = local_58 + 1) {
      *(undefined8 *)((long)pvVar4 + local_58 * 8) = *(undefined8 *)phCommandLists[local_58];
    }
    if (hFence == (ze_fence_handle_t)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = *(undefined8 *)hFence;
    }
    hCommandQueue_local._4_4_ = (*pcVar1)(uVar2,numCommandLists,pvVar4,local_68);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  return hCommandQueue_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandQueueExecuteCommandLists(
        ze_command_queue_handle_t hCommandQueue,        ///< [in] handle of the command queue
        uint32_t numCommandLists,                       ///< [in] number of command lists to execute
        ze_command_list_handle_t* phCommandLists,       ///< [in][range(0, numCommandLists)] list of handles of the command lists
                                                        ///< to execute
        ze_fence_handle_t hFence                        ///< [in][optional] handle of the fence to signal on completion
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_queue_object_t*>( hCommandQueue )->dditable;
        auto pfnExecuteCommandLists = dditable->ze.CommandQueue.pfnExecuteCommandLists;
        if( nullptr == pfnExecuteCommandLists )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandQueue = reinterpret_cast<ze_command_queue_object_t*>( hCommandQueue )->handle;

        // convert loader handles to driver handles
        auto phCommandListsLocal = new ze_command_list_handle_t [numCommandLists];
        for( size_t i = 0; ( nullptr != phCommandLists ) && ( i < numCommandLists ); ++i )
            phCommandListsLocal[ i ] = reinterpret_cast<ze_command_list_object_t*>( phCommandLists[ i ] )->handle;

        // convert loader handle to driver handle
        hFence = ( hFence ) ? reinterpret_cast<ze_fence_object_t*>( hFence )->handle : nullptr;

        // forward to device-driver
        result = pfnExecuteCommandLists( hCommandQueue, numCommandLists, phCommandListsLocal, hFence );
        delete []phCommandListsLocal;

        return result;
    }